

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unisetspan.cpp
# Opt level: O0

int32_t __thiscall
icu_63::UnicodeSetStringSpan::spanBackUTF8
          (UnicodeSetStringSpan *this,uint8_t *s,int32_t length,USetSpanCondition spanCondition)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  undefined4 uVar4;
  UBool UVar5;
  int32_t iVar6;
  int32_t iVar7;
  int32_t iVar8;
  int local_a8;
  int32_t oldPos;
  int32_t dec_1;
  int32_t overlap_1;
  int32_t maxOverlap;
  int32_t maxDec;
  int32_t dec;
  undefined1 uStack_88;
  undefined1 uStack_87;
  uint8_t __t1;
  uint8_t __b;
  int32_t len1;
  int32_t overlap;
  int32_t length8;
  uint8_t *s8;
  uint8_t *spanBackUTF8Lengths;
  int local_68;
  int32_t stringsLength;
  int32_t i;
  undefined1 local_58 [8];
  OffsetList offsets;
  int32_t spanLength;
  int32_t pos;
  USetSpanCondition spanCondition_local;
  int32_t length_local;
  uint8_t *s_local;
  UnicodeSetStringSpan *this_local;
  
  if (spanCondition == USET_SPAN_NOT_CONTAINED) {
    this_local._4_4_ = spanNotBackUTF8(this,s,length);
  }
  else {
    offsets._36_4_ = UnicodeSet::spanBackUTF8(&this->spanSet,(char *)s,length,USET_SPAN_CONTAINED);
    if (offsets._36_4_ != 0) {
      offsets.staticList._12_4_ = length - offsets._36_4_;
      OffsetList::OffsetList((OffsetList *)local_58);
      if (spanCondition == USET_SPAN_CONTAINED) {
        OffsetList::setMaxLength((OffsetList *)local_58,this->maxLength8);
      }
      iVar6 = UVector::size(this->strings);
      s8 = this->spanLengths;
      if (this->all != '\0') {
        s8 = s8 + iVar6 * 3;
      }
LAB_0038d73f:
      _overlap = this->utf8;
      if (spanCondition == USET_SPAN_CONTAINED) {
        for (local_68 = 0; local_68 < iVar6; local_68 = local_68 + 1) {
          iVar3 = this->utf8Lengths[local_68];
          if (iVar3 != 0) {
            _uStack_88 = (uint)s8[local_68];
            if (_uStack_88 == 0xff) {
              _overlap = _overlap + iVar3;
            }
            else {
              if (0xfd < _uStack_88) {
                iVar8 = 1;
                dec = 1;
                bVar1 = *_overlap;
                iVar7 = iVar8;
                if (((byte)(bVar1 + 0x3e) < 0x33) && (iVar7 = dec, iVar3 != 1)) {
                  bVar2 = _overlap[1];
                  if ((bVar1 < 0xe0) || (0xef < bVar1)) {
                    if (bVar1 < 0xe0) {
                      iVar7 = iVar8;
                      if ((char)bVar2 < -0x40) {
                        iVar7 = 2;
                      }
                    }
                    else {
                      iVar7 = iVar8;
                      if (((int)""[(int)(uint)bVar2 >> 4] & 1 << (bVar1 & 7)) != 0) {
                        dec = 2;
                        iVar7 = 2;
                        if ((iVar3 != 2) && (iVar7 = dec, (char)_overlap[2] < -0x40)) {
                          dec = 3;
                          iVar7 = 3;
                          if ((iVar3 != 3) && (iVar7 = dec, (char)_overlap[3] < -0x40)) {
                            dec = 4;
                            iVar7 = dec;
                          }
                        }
                      }
                    }
                  }
                  else {
                    iVar7 = iVar8;
                    if (((int)" 000000000000\x1000"[(int)(bVar1 & 0xf)] &
                        1 << (sbyte)((int)(uint)bVar2 >> 5)) != 0) {
                      dec = 2;
                      iVar7 = 2;
                      if ((iVar3 != 2) && (iVar7 = dec, (char)_overlap[2] < -0x40)) {
                        iVar7 = 3;
                      }
                    }
                  }
                }
                dec = iVar7;
                _uStack_88 = iVar3 - dec;
              }
              if ((int)offsets.staticList._12_4_ < (int)_uStack_88) {
                uStack_88 = offsets.staticList[0xc];
                uStack_87 = offsets.staticList[0xd];
                __t1 = offsets.staticList[0xe];
                __b = offsets.staticList[0xf];
              }
              for (maxDec = iVar3 - _uStack_88; maxDec <= (int)offsets._36_4_; maxDec = maxDec + 1)
              {
                if (((-0x41 < (char)s[offsets._36_4_ - maxDec]) &&
                    (UVar5 = OffsetList::containsOffset((OffsetList *)local_58,maxDec),
                    UVar5 == '\0')) &&
                   (UVar5 = matches8(s + ((long)(int)offsets._36_4_ - (long)maxDec),_overlap,iVar3),
                   UVar5 != '\0')) {
                  if (maxDec == offsets._36_4_) {
                    this_local._4_4_ = 0;
                    goto LAB_0038ddcf;
                  }
                  OffsetList::addOffset((OffsetList *)local_58,maxDec);
                }
                if (_uStack_88 == 0) break;
                _uStack_88 = _uStack_88 - 1;
              }
              _overlap = _overlap + iVar3;
            }
          }
        }
      }
      else {
        overlap_1 = 0;
        dec_1 = 0;
        for (local_68 = 0; local_68 < iVar6; local_68 = local_68 + 1) {
          iVar3 = this->utf8Lengths[local_68];
          if (iVar3 != 0) {
            oldPos = (uint)s8[local_68];
            if (0xfd < s8[local_68]) {
              oldPos = iVar3;
            }
            if ((int)offsets.staticList._12_4_ < oldPos) {
              oldPos._0_1_ = offsets.staticList[0xc];
              oldPos._1_1_ = offsets.staticList[0xd];
              oldPos._2_1_ = offsets.staticList[0xe];
              oldPos._3_1_ = offsets.staticList[0xf];
            }
            local_a8 = iVar3 - oldPos;
            while( true ) {
              if (((int)offsets._36_4_ < local_a8) || (oldPos < dec_1)) goto LAB_0038dc00;
              if (((-0x41 < (char)s[offsets._36_4_ - local_a8]) &&
                  ((dec_1 < oldPos || (overlap_1 < local_a8)))) &&
                 (UVar5 = matches8(s + ((long)(int)offsets._36_4_ - (long)local_a8),_overlap,iVar3),
                 UVar5 != '\0')) break;
              oldPos = oldPos + -1;
              local_a8 = local_a8 + 1;
            }
            overlap_1 = local_a8;
            dec_1 = oldPos;
LAB_0038dc00:
            _overlap = _overlap + iVar3;
          }
        }
        if ((overlap_1 != 0) || (dec_1 != 0)) {
          offsets._36_4_ = offsets._36_4_ - overlap_1;
          if (offsets._36_4_ == 0) {
            this_local._4_4_ = 0;
            goto LAB_0038ddcf;
          }
          offsets.staticList[0xc] = '\0';
          offsets.staticList[0xd] = '\0';
          offsets.staticList[0xe] = '\0';
          offsets.staticList[0xf] = '\0';
          goto LAB_0038d73f;
        }
      }
      if ((offsets.staticList._12_4_ == 0) && (offsets._36_4_ != length)) {
        UVar5 = OffsetList::isEmpty((OffsetList *)local_58);
        uVar4 = offsets._36_4_;
        if (UVar5 == '\0') {
          offsets.staticList._12_4_ = spanOneBackUTF8(&this->spanSet,s,offsets._36_4_);
          if ((int)offsets.staticList._12_4_ < 1) goto LAB_0038dda4;
          if (offsets.staticList._12_4_ == offsets._36_4_) {
            this_local._4_4_ = 0;
LAB_0038ddcf:
            OffsetList::~OffsetList((OffsetList *)local_58);
            return this_local._4_4_;
          }
          offsets._36_4_ = offsets._36_4_ - offsets.staticList._12_4_;
          OffsetList::shift((OffsetList *)local_58,offsets.staticList._12_4_);
          offsets.staticList[0xc] = '\0';
          offsets.staticList[0xd] = '\0';
          offsets.staticList[0xe] = '\0';
          offsets.staticList[0xf] = '\0';
        }
        else {
          offsets._36_4_ =
               UnicodeSet::spanBackUTF8(&this->spanSet,(char *)s,offsets._36_4_,USET_SPAN_CONTAINED)
          ;
          offsets.staticList._12_4_ = uVar4 - offsets._36_4_;
          this_local._4_4_ = offsets._36_4_;
          if ((offsets._36_4_ == 0) || (offsets.staticList._12_4_ == 0)) goto LAB_0038ddcf;
        }
      }
      else {
        UVar5 = OffsetList::isEmpty((OffsetList *)local_58);
        if (UVar5 != '\0') {
          this_local._4_4_ = offsets._36_4_;
          goto LAB_0038ddcf;
        }
LAB_0038dda4:
        iVar7 = OffsetList::popMinimum((OffsetList *)local_58);
        offsets._36_4_ = offsets._36_4_ - iVar7;
        offsets.staticList[0xc] = '\0';
        offsets.staticList[0xd] = '\0';
        offsets.staticList[0xe] = '\0';
        offsets.staticList[0xf] = '\0';
      }
      goto LAB_0038d73f;
    }
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int32_t UnicodeSetStringSpan::spanBackUTF8(const uint8_t *s, int32_t length, USetSpanCondition spanCondition) const {
    if(spanCondition==USET_SPAN_NOT_CONTAINED) {
        return spanNotBackUTF8(s, length);
    }
    int32_t pos=spanSet.spanBackUTF8((const char *)s, length, USET_SPAN_CONTAINED);
    if(pos==0) {
        return 0;
    }
    int32_t spanLength=length-pos;

    // Consider strings; they may overlap with the span.
    OffsetList offsets;
    if(spanCondition==USET_SPAN_CONTAINED) {
        // Use offset list to try all possibilities.
        offsets.setMaxLength(maxLength8);
    }
    int32_t i, stringsLength=strings.size();
    uint8_t *spanBackUTF8Lengths=spanLengths;
    if(all) {
        spanBackUTF8Lengths+=3*stringsLength;
    }
    for(;;) {
        const uint8_t *s8=utf8;
        int32_t length8;
        if(spanCondition==USET_SPAN_CONTAINED) {
            for(i=0; i<stringsLength; ++i) {
                length8=utf8Lengths[i];
                if(length8==0) {
                    continue;  // String not representable in UTF-8.
                }
                int32_t overlap=spanBackUTF8Lengths[i];
                if(overlap==ALL_CP_CONTAINED) {
                    s8+=length8;
                    continue;  // Irrelevant string.
                }

                // Try to match this string at pos-(length8-overlap)..pos-length8.
                if(overlap>=LONG_SPAN) {
                    overlap=length8;
                    // While contained: No point matching fully inside the code point span.
                    int32_t len1=0;
                    U8_FWD_1(s8, len1, overlap);
                    overlap-=len1;  // Length of the string minus the first code point.
                }
                if(overlap>spanLength) {
                    overlap=spanLength;
                }
                int32_t dec=length8-overlap;  // Keep dec+overlap==length8.
                for(;;) {
                    if(dec>pos) {
                        break;
                    }
                    // Try to match if the decrement is not listed already.
                    // Match at code point boundaries. (The UTF-8 strings were converted
                    // from UTF-16 and are guaranteed to be well-formed.)
                    if( !U8_IS_TRAIL(s[pos-dec]) &&
                        !offsets.containsOffset(dec) &&
                        matches8(s+pos-dec, s8, length8)
                    ) {
                        if(dec==pos) {
                            return 0;  // Reached the start of the string.
                        }
                        offsets.addOffset(dec);
                    }
                    if(overlap==0) {
                        break;
                    }
                    --overlap;
                    ++dec;
                }
                s8+=length8;
            }
        } else /* USET_SPAN_SIMPLE */ {
            int32_t maxDec=0, maxOverlap=0;
            for(i=0; i<stringsLength; ++i) {
                length8=utf8Lengths[i];
                if(length8==0) {
                    continue;  // String not representable in UTF-8.
                }
                int32_t overlap=spanBackUTF8Lengths[i];
                // For longest match, we do need to try to match even an all-contained string
                // to find the match from the latest end.

                // Try to match this string at pos-(length8-overlap)..pos-length8.
                if(overlap>=LONG_SPAN) {
                    overlap=length8;
                    // Longest match: Need to match fully inside the code point span
                    // to find the match from the latest end.
                }
                if(overlap>spanLength) {
                    overlap=spanLength;
                }
                int32_t dec=length8-overlap;  // Keep dec+overlap==length8.
                for(;;) {
                    if(dec>pos || overlap<maxOverlap) {
                        break;
                    }
                    // Try to match if the string is longer or ends later.
                    // Match at code point boundaries. (The UTF-8 strings were converted
                    // from UTF-16 and are guaranteed to be well-formed.)
                    if( !U8_IS_TRAIL(s[pos-dec]) &&
                        (overlap>maxOverlap || /* redundant overlap==maxOverlap && */ dec>maxDec) &&
                        matches8(s+pos-dec, s8, length8)
                    ) {
                        maxDec=dec;  // Longest match from latest end.
                        maxOverlap=overlap;
                        break;
                    }
                    --overlap;
                    ++dec;
                }
                s8+=length8;
            }

            if(maxDec!=0 || maxOverlap!=0) {
                // Longest-match algorithm, and there was a string match.
                // Simply continue before it.
                pos-=maxDec;
                if(pos==0) {
                    return 0;  // Reached the start of the string.
                }
                spanLength=0;  // Match strings from before a string match.
                continue;
            }
        }
        // Finished trying to match all strings at pos.

        if(spanLength!=0 || pos==length) {
            // The position is before an unlimited code point span (spanLength!=0),
            // not before a string match.
            // The only position where spanLength==0 before a span is pos==length.
            // Otherwise, an unlimited code point span is only tried again when no
            // strings match, and if such a non-initial span fails we stop.
            if(offsets.isEmpty()) {
                return pos;  // No strings matched before a span.
            }
            // Match strings from before the next string match.
        } else {
            // The position is before a string match (or a single code point).
            if(offsets.isEmpty()) {
                // No more strings matched before a previous string match.
                // Try another code point span from before the last string match.
                int32_t oldPos=pos;
                pos=spanSet.spanBackUTF8((const char *)s, oldPos, USET_SPAN_CONTAINED);
                spanLength=oldPos-pos;
                if( pos==0 ||           // Reached the start of the string, or
                    spanLength==0       // neither strings nor span progressed.
                ) {
                    return pos;
                }
                continue;  // spanLength>0: Match strings from before a span.
            } else {
                // Try to match only one code point from before a string match if some
                // string matched beyond it, so that we try all possible positions
                // and don't overshoot.
                spanLength=spanOneBackUTF8(spanSet, s, pos);
                if(spanLength>0) {
                    if(spanLength==pos) {
                        return 0;  // Reached the start of the string.
                    }
                    // Match strings before this code point.
                    // There cannot be any decrements below it because UnicodeSet strings
                    // contain multiple code points.
                    pos-=spanLength;
                    offsets.shift(spanLength);
                    spanLength=0;
                    continue;  // Match strings from before a single code point.
                }
                // Match strings from before the next string match.
            }
        }
        pos-=offsets.popMinimum();
        spanLength=0;  // Match strings from before a string match.
    }
}